

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger_recorders.cpp
# Opt level: O2

unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>
MakeDebugUtilsLoaderLogRecorder
          (XrDebugUtilsMessengerCreateInfoEXT *create_info,XrDebugUtilsMessengerEXT debug_messenger)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  XrLoaderLogMessageSeverityFlags XVar3;
  XrLoaderLogMessageTypeFlagBits XVar4;
  undefined8 in_RDX;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  uVar1 = *(undefined8 *)(debug_messenger + 0x28);
  XVar3 = DebugUtilsSeveritiesToLoaderLogMessageSeverities
                    (*(XrDebugUtilsMessageSeverityFlagsEXT *)(debug_messenger + 0x10));
  XVar4 = DebugUtilsMessageTypesToLoaderLogMessageTypes
                    (*(XrDebugUtilsMessageTypeFlagsEXT *)(debug_messenger + 0x18));
  puVar2[3] = uVar1;
  *(undefined4 *)((long)puVar2 + 0xc) = 3;
  puVar2[4] = XVar3;
  puVar2[5] = XVar4;
  *puVar2 = &PTR__LoaderLogRecorder_00149aa8;
  puVar2[6] = *(undefined8 *)(debug_messenger + 0x20);
  puVar2[2] = in_RDX;
  *(undefined1 *)(puVar2 + 1) = 1;
  *(undefined8 **)create_info = puVar2;
  return (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         create_info;
}

Assistant:

std::unique_ptr<LoaderLogRecorder> MakeDebugUtilsLoaderLogRecorder(const XrDebugUtilsMessengerCreateInfoEXT* create_info,
                                                                   XrDebugUtilsMessengerEXT debug_messenger) {
    std::unique_ptr<LoaderLogRecorder> recorder(new DebugUtilsLogRecorder(create_info, debug_messenger));
    return recorder;
}